

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O0

MIR_type_t get_result_type(MIR_type_t arg_type1,MIR_type_t arg_type2)

{
  MIR_type_t arg_type2_local;
  MIR_type_t arg_type1_local;
  
  arg_type2_local = arg_type1;
  if (((arg_type1 != arg_type2) && (arg_type2_local = arg_type2, arg_type1 != 0x14)) &&
     (arg_type2_local = arg_type1, arg_type2 != 0x14)) {
    if ((arg_type1 == MIR_T_UNDEF) || (arg_type2 == MIR_T_UNDEF)) {
      arg_type2_local = MIR_T_UNDEF;
    }
    else if (((arg_type1 == MIR_T_I64) || (arg_type1 == MIR_T_I32)) ||
            ((arg_type2 == MIR_T_I64 || (arg_type2 == MIR_T_I32)))) {
      arg_type2_local = MIR_T_I64;
    }
    else if ((((arg_type1 == MIR_T_LD) || (arg_type2 == MIR_T_LD)) || (arg_type1 == 0x15)) ||
            (arg_type2 == 0x15)) {
      arg_type2_local = MIR_T_UNDEF;
    }
    else {
      arg_type2_local = MIR_T_D;
    }
  }
  return arg_type2_local;
}

Assistant:

static MIR_type_t get_result_type (MIR_type_t arg_type1, MIR_type_t arg_type2) {
  if (arg_type1 == arg_type2) return arg_type1;
  if ((enum add_arg_class) arg_type1 == NO_CLASS) return arg_type2;
  if ((enum add_arg_class) arg_type2 == NO_CLASS) return arg_type1;

  if (arg_type1 == MIR_T_UNDEF || arg_type2 == MIR_T_UNDEF) return MIR_T_UNDEF;

  if (arg_type1 == MIR_T_I64 || arg_type1 == MIR_T_I32 || arg_type2 == MIR_T_I64
      || arg_type2 == MIR_T_I32)
    return MIR_T_I64;

  if (arg_type1 == MIR_T_LD || arg_type2 == MIR_T_LD
      || (enum add_arg_class) arg_type1 == X87UP_CLASS
      || (enum add_arg_class) arg_type2 == X87UP_CLASS)
    return MIR_T_UNDEF;

  return MIR_T_D;
}